

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O2

void event_queue_remove_timeout(event_base *base,event *ev)

{
  short *psVar1;
  ushort uVar2;
  event *peVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  event **ppeVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  event *peVar13;
  bool bVar14;
  bool bVar15;
  ulong uVar12;
  
  if (((base->th_base_lock != (void *)0x0) && (evthread_lock_debugging_enabled_ != 0)) &&
     (iVar7 = evthread_is_debug_lock_held_(base->th_base_lock), iVar7 == 0)) {
    event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
               ,0xcc8,"evthread_is_debug_lock_held_((base)->th_base_lock)",
               "event_queue_remove_timeout");
  }
  uVar2 = (ev->ev_evcallback).evcb_flags;
  if ((uVar2 & 1) == 0) {
    event_errx(1,"%s: %p(fd %d) not on queue %x","event_queue_remove_timeout",ev,
               (ulong)(uint)ev->ev_fd,1);
  }
  base->event_count = base->event_count - (uint)((uVar2 & 0x10) == 0);
  psVar1 = &(ev->ev_evcallback).evcb_flags;
  *(byte *)psVar1 = (byte)*psVar1 & 0xfe;
  iVar7 = is_common_timeout(&ev->ev_timeout,base);
  if (iVar7 != 0) {
    peVar3 = (ev->ev_timeout_pos).ev_next_with_common_timeout.tqe_next;
    if (peVar3 == (event *)0x0) {
      ppeVar8 = (ev->ev_timeout_pos).ev_next_with_common_timeout.tqe_prev;
      *(event ***)
       (*(long *)((long)base->common_timeout_queues +
                 (ulong)((uint)(ev->ev_timeout).tv_usec >> 0x11 & 0x7f8)) + 8) = ppeVar8;
    }
    else {
      ppeVar8 = (ev->ev_timeout_pos).ev_next_with_common_timeout.tqe_prev;
      (peVar3->ev_timeout_pos).ev_next_with_common_timeout.tqe_prev = ppeVar8;
    }
    *ppeVar8 = (ev->ev_timeout_pos).ev_next_with_common_timeout.tqe_next;
    return;
  }
  if ((ev->ev_timeout_pos).min_heap_idx == -1) {
    return;
  }
  ppeVar8 = (base->timeheap).p;
  uVar11 = (base->timeheap).n - 1;
  uVar12 = (ulong)uVar11;
  (base->timeheap).n = uVar11;
  peVar3 = ppeVar8[uVar12];
  uVar11 = (ev->ev_timeout_pos).min_heap_idx;
  if (0 < (int)uVar11) {
    uVar10 = (ulong)(uVar11 - 1 >> 1);
    peVar13 = ppeVar8[uVar10];
    lVar4 = (peVar3->ev_timeout).tv_sec;
    lVar5 = (peVar13->ev_timeout).tv_sec;
    bVar15 = SBORROW8(lVar5,lVar4);
    lVar6 = lVar5 - lVar4;
    bVar14 = lVar5 == lVar4;
    if (bVar14) {
      lVar4 = (peVar13->ev_timeout).tv_usec;
      lVar5 = (peVar3->ev_timeout).tv_usec;
      bVar15 = SBORROW8(lVar4,lVar5);
      lVar6 = lVar4 - lVar5;
      bVar14 = lVar4 == lVar5;
    }
    if (!bVar14 && bVar15 == lVar6 < 0) {
      do {
        while( true ) {
          uVar12 = uVar10;
          uVar9 = (uint)uVar12;
          ppeVar8[uVar11] = peVar13;
          (peVar13->ev_timeout_pos).min_heap_idx = uVar11;
          ppeVar8 = (base->timeheap).p;
          if (uVar9 == 0) {
            uVar12 = 0;
            goto LAB_001c62ea;
          }
          uVar10 = (ulong)(uVar9 - 1 >> 1);
          peVar13 = ppeVar8[uVar10];
          lVar4 = (peVar3->ev_timeout).tv_sec;
          lVar5 = (peVar13->ev_timeout).tv_sec;
          uVar11 = uVar9;
          if (lVar5 != lVar4) break;
          if ((peVar13->ev_timeout).tv_usec <= (peVar3->ev_timeout).tv_usec) goto LAB_001c62ea;
        }
      } while (lVar4 < lVar5);
      goto LAB_001c62ea;
    }
  }
  while( true ) {
    uVar9 = uVar11 * 2 + 2;
    if ((uint)uVar12 < uVar9) break;
    iVar7 = -1;
    if (uVar9 != (uint)uVar12) {
      lVar4 = (ppeVar8[(ulong)(uVar11 * 2) + 1]->ev_timeout).tv_sec;
      lVar5 = (ppeVar8[uVar9]->ev_timeout).tv_sec;
      bVar15 = SBORROW8(lVar5,lVar4);
      lVar6 = lVar5 - lVar4;
      bVar14 = lVar5 == lVar4;
      if (bVar14) {
        lVar4 = (ppeVar8[uVar9]->ev_timeout).tv_usec;
        lVar5 = (ppeVar8[(ulong)(uVar11 * 2) + 1]->ev_timeout).tv_usec;
        bVar15 = SBORROW8(lVar4,lVar5);
        lVar6 = lVar4 - lVar5;
        bVar14 = lVar4 == lVar5;
      }
      iVar7 = -(uint)(!bVar14 && bVar15 == lVar6 < 0);
    }
    peVar13 = ppeVar8[iVar7 + uVar9];
    lVar4 = (peVar13->ev_timeout).tv_sec;
    lVar5 = (peVar3->ev_timeout).tv_sec;
    bVar15 = SBORROW8(lVar5,lVar4);
    lVar6 = lVar5 - lVar4;
    bVar14 = lVar5 == lVar4;
    if (bVar14) {
      lVar4 = (peVar3->ev_timeout).tv_usec;
      lVar5 = (peVar13->ev_timeout).tv_usec;
      bVar15 = SBORROW8(lVar4,lVar5);
      lVar6 = lVar4 - lVar5;
      bVar14 = lVar4 == lVar5;
    }
    if (bVar14 || bVar15 != lVar6 < 0) break;
    ppeVar8[uVar11] = peVar13;
    (peVar13->ev_timeout_pos).min_heap_idx = uVar11;
    uVar12 = (ulong)(base->timeheap).n;
    ppeVar8 = (base->timeheap).p;
    uVar11 = iVar7 + uVar9;
  }
  uVar12 = (ulong)uVar11;
LAB_001c62ea:
  ppeVar8[uVar12] = peVar3;
  (peVar3->ev_timeout_pos).min_heap_idx = (int)uVar12;
  (ev->ev_timeout_pos).min_heap_idx = -1;
  return;
}

Assistant:

static void
event_queue_remove_timeout(struct event_base *base, struct event *ev)
{
	EVENT_BASE_ASSERT_LOCKED(base);
	if (EVUTIL_FAILURE_CHECK(!(ev->ev_flags & EVLIST_TIMEOUT))) {
		event_errx(1, "%s: %p(fd "EV_SOCK_FMT") not on queue %x", __func__,
		    ev, EV_SOCK_ARG(ev->ev_fd), EVLIST_TIMEOUT);
		return;
	}
	DECR_EVENT_COUNT(base, ev->ev_flags);
	ev->ev_flags &= ~EVLIST_TIMEOUT;

	if (is_common_timeout(&ev->ev_timeout, base)) {
		struct common_timeout_list *ctl =
		    get_common_timeout_list(base, &ev->ev_timeout);
		TAILQ_REMOVE(&ctl->events, ev,
		    ev_timeout_pos.ev_next_with_common_timeout);
	} else {
		min_heap_erase_(&base->timeheap, ev);
	}
}